

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void soplex::enQueueMax(int *heap,int *size,int elem)

{
  int iVar1;
  int j;
  int i;
  int elem_local;
  int *size_local;
  int *heap_local;
  
  j = *size;
  *size = j + 1;
  while ((0 < j && (iVar1 = (j + -1) / 2, heap[iVar1] < elem))) {
    heap[j] = heap[iVar1];
    j = iVar1;
  }
  heap[j] = elem;
  return;
}

Assistant:

static inline void enQueueMax(int* heap, int* size, int elem)
{
   int i, j;

   j = (*size)++;

   while(j > 0)
   {
      i = (j - 1) / 2;

      if(elem > heap[i])
      {
         heap[j] = heap[i];
         j = i;
      }
      else
         break;
   }

   heap[j] = elem;

#ifdef SOPLEX_DEBUG

   // no NDEBUG define, since this block is really expensive
   for(i = 1; i < *size; ++i)
      for(j = 0; j < i; ++j)
         assert(heap[i] != heap[j]);

#endif  /* SOPLEX_DEBUG */
}